

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengineex.cpp
# Opt level: O1

void __thiscall QPaintEngineExPrivate::replayClipOperations(QPaintEngineExPrivate *this)

{
  QPaintEngine *this_00;
  _Head_base<0UL,_QPainterPrivate_*,_false> _Var1;
  unique_ptr<QPainterState,_std::default_delete<QPainterState>_> uVar2;
  bool bVar3;
  QPainter *pQVar4;
  long lVar5;
  long lVar6;
  QPaintEngineState *pQVar7;
  qreal *pqVar8;
  QTransform *pQVar9;
  QPaintEngineState *pQVar10;
  long lVar11;
  long in_FS_OFFSET;
  byte bVar12;
  QTransform transform;
  QVectorPath local_108;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  QTransform local_88;
  long local_38;
  
  bVar12 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QPaintEnginePrivate).q_ptr;
  pQVar4 = QPaintEngine::painter(this_00);
  if ((pQVar4 != (QPainter *)0x0) &&
     (_Var1._M_head_impl =
           (pQVar4->d_ptr)._M_t.
           super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
           super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
           super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl,
     _Var1._M_head_impl != (QPainterPrivate *)0x0)) {
    uVar2._M_t.super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
    super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
    super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl = ((_Var1._M_head_impl)->state)._M_t;
    pqVar8 = (qreal *)&DAT_006af1b8;
    pQVar9 = &local_88;
    for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
      pQVar9->m_matrix[0][0] = *pqVar8;
      pqVar8 = pqVar8 + (ulong)bVar12 * -2 + 1;
      pQVar9 = (QTransform *)((long)pQVar9 + ((ulong)bVar12 * -2 + 1) * 8);
    }
    pQVar7 = this_00->state + -2;
    if (this_00->state == (QPaintEngineState *)0x0) {
      pQVar7 = (QPaintEngineState *)0x0;
    }
    pQVar7 = pQVar7 + 0x36;
    pQVar9 = &local_88;
    for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
      pQVar9->m_matrix[0][0] = *(qreal *)pQVar7;
      pQVar7 = pQVar7 + (ulong)bVar12 * -4 + 2;
      pQVar9 = (QTransform *)((long)pQVar9 + ((ulong)bVar12 * -2 + 1) * 8);
    }
    lVar5 = *(long *)((long)uVar2._M_t.
                            super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>
                            .super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl + 0x80);
    if (lVar5 != 0) {
      lVar11 = *(long *)((long)uVar2._M_t.
                               super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>
                               .super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl + 0x78) +
               0x60;
      lVar5 = lVar5 * 0xa0;
      do {
        pQVar7 = this_00->state;
        if (pQVar7 != (QPaintEngineState *)0x0) {
          pQVar7 = pQVar7 + -2;
        }
        bVar3 = QTransform::operator!=((QTransform *)(lVar11 + -0x58),(QTransform *)(pQVar7 + 0x36))
        ;
        if (bVar3) {
          pQVar7 = this_00->state + -2;
          if (this_00->state == (QPaintEngineState *)0x0) {
            pQVar7 = (QPaintEngineState *)0x0;
          }
          pQVar9 = (QTransform *)(lVar11 + -0x58);
          pQVar10 = pQVar7 + 0x36;
          for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
            *(qreal *)pQVar10 = pQVar9->m_matrix[0][0];
            pQVar9 = (QTransform *)((long)pQVar9 + ((ulong)bVar12 * -2 + 1) * 8);
            pQVar10 = pQVar10 + (ulong)bVar12 * -4 + 2;
          }
          *(undefined2 *)
           &pQVar7[0x48].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
            super_QFlagsStorage<QPaintEngine::DirtyFlag>.i = *(undefined2 *)(lVar11 + -0x10);
          (*this_00->_vptr_QPaintEngine[0x27])(this_00);
        }
        switch(*(undefined4 *)(lVar11 + -0x60)) {
        case 0:
          (*this_00->_vptr_QPaintEngine[0x1e])(this_00,lVar11 + 8,(ulong)*(uint *)(lVar11 + -8));
          break;
        case 1:
          (*this_00->_vptr_QPaintEngine[0x1f])(this_00,lVar11,(ulong)*(uint *)(lVar11 + -8));
          break;
        case 2:
          (*this_00->_vptr_QPaintEngine[0x1d])(this_00,lVar11 + 0x10,(ulong)*(uint *)(lVar11 + -8));
          break;
        case 3:
          local_c8 = *(double *)(lVar11 + 0x20);
          dStack_c0 = *(double *)(lVar11 + 0x28);
          local_a8 = local_c8 + *(double *)(lVar11 + 0x30);
          dStack_a0 = dStack_c0 + *(double *)(lVar11 + 0x38);
          local_b8 = local_c8 + *(double *)(lVar11 + 0x30);
          local_108.m_cp_rect.x2._0_4_ = 0xffffffff;
          local_108.m_cp_rect.x2._4_4_ = 0xffffffff;
          local_108.m_cp_rect.y2._0_4_ = 0xffffffff;
          local_108.m_cp_rect.y2._4_4_ = 0xffffffff;
          local_108.m_cp_rect.x1._0_4_ = 0xffffffff;
          local_108.m_cp_rect.x1._4_4_ = 0xffffffff;
          local_108.m_cp_rect.y1._0_4_ = 0xffffffff;
          local_108.m_cp_rect.y1._4_4_ = 0xffffffff;
          local_108.m_cache = (CacheEntry *)&DAT_aaaaaaaaaaaaaaaa;
          local_108.m_elements = (ElementType *)0x0;
          local_108.m_points = &local_c8;
          local_108.m_count = 4;
          local_108.m_hints = 0x11;
          dStack_b0 = dStack_c0;
          local_98 = local_c8;
          dStack_90 = dStack_a0;
          (*this_00->_vptr_QPaintEngine[0x1c])(this_00,&local_108,(ulong)*(uint *)(lVar11 + -8));
          QVectorPath::~QVectorPath(&local_108);
        }
        lVar11 = lVar11 + 0xa0;
        lVar5 = lVar5 + -0xa0;
      } while (lVar5 != 0);
    }
    pQVar7 = this_00->state + -2;
    if (this_00->state == (QPaintEngineState *)0x0) {
      pQVar7 = (QPaintEngineState *)0x0;
    }
    bVar3 = QTransform::operator!=(&local_88,(QTransform *)(pQVar7 + 0x36));
    if (bVar3) {
      pQVar7 = this_00->state + -2;
      if (this_00->state == (QPaintEngineState *)0x0) {
        pQVar7 = (QPaintEngineState *)0x0;
      }
      pQVar9 = &local_88;
      pQVar10 = pQVar7 + 0x36;
      for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
        *(qreal *)pQVar10 = pQVar9->m_matrix[0][0];
        pQVar9 = (QTransform *)((long)pQVar9 + ((ulong)bVar12 * -2 + 1) * 8);
        pQVar10 = pQVar10 + (ulong)bVar12 * -4 + 2;
      }
      *(undefined2 *)
       &pQVar7[0x48].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
        super_QFlagsStorage<QPaintEngine::DirtyFlag>.i = local_88._72_2_;
      (*this_00->_vptr_QPaintEngine[0x27])(this_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPaintEngineExPrivate::replayClipOperations()
{
    Q_Q(QPaintEngineEx);

    QPainter *p = q->painter();
    if (!p || !p->d_ptr)
        return;

    const QList<QPainterClipInfo> &clipInfo = p->d_ptr->state->clipInfo;

    QTransform transform = q->state()->matrix;

    for (const QPainterClipInfo &info : clipInfo) {

        if (info.matrix != q->state()->matrix) {
            q->state()->matrix = info.matrix;
            q->transformChanged();
        }

        switch (info.clipType) {
        case QPainterClipInfo::RegionClip:
            q->clip(info.region, info.operation);
            break;
        case QPainterClipInfo::PathClip:
            q->clip(info.path, info.operation);
            break;
        case QPainterClipInfo::RectClip:
            q->clip(info.rect, info.operation);
            break;
        case QPainterClipInfo::RectFClip: {
            qreal right = info.rectf.x() + info.rectf.width();
            qreal bottom = info.rectf.y() + info.rectf.height();
            qreal pts[] = { info.rectf.x(), info.rectf.y(),
                            right, info.rectf.y(),
                            right, bottom,
                            info.rectf.x(), bottom };
            QVectorPath vp(pts, 4, nullptr, QVectorPath::RectangleHint);
            q->clip(vp, info.operation);
            break;
            }
        }
    }

    if (transform != q->state()->matrix) {
        q->state()->matrix = transform;
        q->transformChanged();
    }
}